

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cc
# Opt level: O3

void __thiscall
prometheus::detail::Endpoint::Endpoint(Endpoint *this,CivetServer *server,string *uri)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Atomic_word *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  int iVar6;
  pointer *__ptr;
  weak_ptr<prometheus::Collectable> local_40;
  
  this->server_ = server;
  paVar1 = &(this->uri_).field_2;
  (this->uri_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (uri->_M_dataplus)._M_p;
  paVar2 = &uri->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&uri->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->uri_).field_2 + 8) = uVar5;
  }
  else {
    (this->uri_)._M_dataplus._M_p = pcVar4;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->uri_)._M_string_length = uri->_M_string_length;
  (uri->_M_dataplus)._M_p = (pointer)paVar2;
  uri->_M_string_length = 0;
  (uri->field_2)._M_local_buf[0] = '\0';
  (this->endpoint_registry_).super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<prometheus::Registry,std::allocator<prometheus::Registry>>
            (&(this->endpoint_registry_).
              super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Registry **)&this->endpoint_registry_,(allocator<prometheus::Registry> *)&local_40);
  make_unique<prometheus::detail::MetricsHandler,prometheus::Registry&>
            ((detail *)&this->metrics_handler_,
             (this->endpoint_registry_).
             super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (this->auth_handler_)._M_t.
  super___uniq_ptr_impl<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
  ._M_t.
  super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
  .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl =
       (BasicAuthHandler *)0x0;
  local_40.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->endpoint_registry_).
         super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Collectable;
  local_40.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->endpoint_registry_).
       super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_40.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count =
           (local_40.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count =
           (local_40.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  MetricsHandler::RegisterCollectable
            ((this->metrics_handler_)._M_t.
             super___uniq_ptr_impl<prometheus::detail::MetricsHandler,_std::default_delete<prometheus::detail::MetricsHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_prometheus::detail::MetricsHandler_*,_std::default_delete<prometheus::detail::MetricsHandler>_>
             .super__Head_base<0UL,_prometheus::detail::MetricsHandler_*,_false>._M_head_impl,
             &local_40);
  if (local_40.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3 = &(local_40.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar6 = *p_Var3;
      *p_Var3 = *p_Var3 + -1;
      UNLOCK();
    }
    else {
      iVar6 = (local_40.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_40.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar6 + -1;
    }
    if (iVar6 == 1) {
      (*(local_40.super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  CivetServer::addHandler
            (this->server_,&this->uri_,
             &((this->metrics_handler_)._M_t.
               super___uniq_ptr_impl<prometheus::detail::MetricsHandler,_std::default_delete<prometheus::detail::MetricsHandler>_>
               ._M_t.
               super__Tuple_impl<0UL,_prometheus::detail::MetricsHandler_*,_std::default_delete<prometheus::detail::MetricsHandler>_>
               .super__Head_base<0UL,_prometheus::detail::MetricsHandler_*,_false>._M_head_impl)->
              super_CivetHandler);
  return;
}

Assistant:

Endpoint::Endpoint(CivetServer& server, std::string uri)
    : server_(server),
      uri_(std::move(uri)),
      endpoint_registry_(std::make_shared<Registry>()),
      metrics_handler_(
          detail::make_unique<MetricsHandler>(*endpoint_registry_)) {
  RegisterCollectable(endpoint_registry_);
  server_.addHandler(uri_, metrics_handler_.get());
}